

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sprites.cpp
# Opt level: O2

void R_InitSprites(void)

{
  PClassPlayerPawn *pPVar1;
  BYTE *pBVar2;
  double dVar3;
  FPlayerClass *pFVar4;
  size_t sVar5;
  FString __src;
  int iVar6;
  FPlayerSkin *pFVar7;
  spritedef_t *psVar8;
  char *palname;
  ulong uVar9;
  ulong uVar10;
  FString classface;
  int local_38;
  int lastlump;
  
  palname = "SPALDOOM";
  if (gameinfo.gametype == GAME_DoomChex) {
    palname = "SPALHTIC";
  }
  R_CreateSkinTranslation(palname);
  numskins = (size_t)PlayerClasses.Count;
  lastlump = 0;
  while( true ) {
    iVar6 = FWadCollection::FindLump(&Wads,"S_SKIN",&lastlump,true);
    if (iVar6 == -1) break;
    numskins = numskins + 1;
  }
  if (skins != (FPlayerSkin *)0x0) {
    operator_delete__(skins);
  }
  sVar5 = numskins;
  uVar10 = numskins << 6;
  pFVar7 = (FPlayerSkin *)operator_new__(-(ulong)(numskins >> 0x3a != 0) | uVar10);
  skins = pFVar7;
  memset(pFVar7,0,uVar10);
  pFVar4 = PlayerClasses.Array;
  for (uVar10 = 0; uVar10 < sVar5; uVar10 = (ulong)((int)uVar10 + 1)) {
    pPVar1 = pFVar4->Type;
    pFVar7[uVar10].range0start = pPVar1->ColorRangeStart;
    pFVar7[uVar10].range0end = pPVar1->ColorRangeEnd;
    pBVar2 = (pPVar1->super_PClassActor).super_PClass.Defaults;
    dVar3 = *(double *)(pBVar2 + 0x100);
    pFVar7[uVar10].Scale.X = *(double *)(pBVar2 + 0xf8);
    pFVar7[uVar10].Scale.Y = dVar3;
  }
  R_InitSpriteDefs();
  R_InitVoxels();
  NumStdSprites = sprites.Count;
  R_InitSkins();
  uVar10 = 0;
  do {
    if (PlayerClasses.Count <= uVar10) {
      return;
    }
    pPVar1 = PlayerClasses.Array[uVar10].Type;
    FString::AttachToOther(&classface,&pPVar1->Face);
    __src = classface;
    pFVar7 = skins;
    skins[uVar10].name[4] = '\0';
    builtin_strncpy(pFVar7[uVar10].name,"Base",4);
    if (*(int *)(classface.Chars + -0xc) == 0) {
LAB_004fe6c2:
      skins[uVar10].face[0] = 'S';
      skins[uVar10].face[1] = 'T';
      skins[uVar10].face[2] = 'F';
      skins[uVar10].face[3] = '\0';
    }
    else {
      iVar6 = strcmp(classface.Chars,"None");
      if (iVar6 == 0) goto LAB_004fe6c2;
      strcpy(skins[uVar10].face,__src.Chars);
    }
    pFVar7 = skins;
    skins[uVar10].range0start = pPVar1->ColorRangeStart;
    pFVar7[uVar10].range0end = pPVar1->ColorRangeEnd;
    pBVar2 = (pPVar1->super_PClassActor).super_PClass.Defaults;
    dVar3 = *(double *)(pBVar2 + 0x100);
    pFVar7[uVar10].Scale.X = *(double *)(pBVar2 + 0xf8);
    pFVar7[uVar10].Scale.Y = dVar3;
    pFVar7[uVar10].sprite = *(int *)(*(long *)(pBVar2 + 0x448) + 0x10);
    pFVar7[uVar10].namespc = 0;
    local_38 = (int)uVar10;
    TArray<int,_int>::Push(&PlayerClasses.Array[uVar10].Skins,&local_38);
    if (sprites.Array[skins[uVar10].sprite].field_0.dwName == 0x59414c50) {
      psVar8 = sprites.Array;
      for (uVar9 = 0; sprites.Count != uVar9; uVar9 = uVar9 + 1) {
        if ((psVar8->field_0).dwName == deh.PlayerSprite._0_4_) {
          skins[uVar10].sprite = (int)uVar9;
          break;
        }
        psVar8 = psVar8 + 1;
      }
    }
    FString::~FString(&classface);
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

void R_InitSprites ()
{
	int lump, lastlump;
	unsigned int i, j;

	// [RH] Create a standard translation to map skins between Heretic and Doom
	if (gameinfo.gametype == GAME_DoomChex)
	{
		R_CreateSkinTranslation ("SPALHTIC");
	}
	else
	{
		R_CreateSkinTranslation ("SPALDOOM");
	}

	// [RH] Count the number of skins.
	numskins = PlayerClasses.Size ();
	lastlump = 0;
	while ((lump = Wads.FindLump ("S_SKIN", &lastlump, true)) != -1)
	{
		numskins++;
	}

	// [RH] Do some preliminary setup
	if (skins != NULL) delete [] skins;
	skins = new FPlayerSkin[numskins];
	memset (skins, 0, sizeof(*skins) * numskins);
	for (i = 0; i < numskins; i++)
	{ // Assume Doom skin by default
		PClassPlayerPawn *type = PlayerClasses[0].Type;
		skins[i].range0start = type->ColorRangeStart;
		skins[i].range0end = type->ColorRangeEnd;
		skins[i].Scale = GetDefaultByType (type)->Scale;
	}

	R_InitSpriteDefs ();
	R_InitVoxels();		// [RH] Parse VOXELDEF
	NumStdSprites = sprites.Size();
	R_InitSkins ();		// [RH] Finish loading skin data

	// [RH] Set up base skin
	// [GRB] Each player class has its own base skin
	for (i = 0; i < PlayerClasses.Size (); i++)
	{
		PClassPlayerPawn *basetype = PlayerClasses[i].Type;
		FString classface = basetype->Face;

		strcpy (skins[i].name, "Base");
		if (classface.IsEmpty() || strcmp(classface, "None") == 0)
		{
			skins[i].face[0] = 'S';
			skins[i].face[1] = 'T';
			skins[i].face[2] = 'F';
			skins[i].face[3] = '\0';
		}
		else
		{
			strcpy(skins[i].face, classface);
		}
		skins[i].range0start = basetype->ColorRangeStart;
		skins[i].range0end = basetype->ColorRangeEnd;
		skins[i].Scale = GetDefaultByType (basetype)->Scale;
		skins[i].sprite = GetDefaultByType (basetype)->SpawnState->sprite;
		skins[i].namespc = ns_global;

		PlayerClasses[i].Skins.Push (i);

		if (memcmp (sprites[skins[i].sprite].name, "PLAY", 4) == 0)
		{
			for (j = 0; j < sprites.Size (); j++)
			{
				if (memcmp (sprites[j].name, deh.PlayerSprite, 4) == 0)
				{
					skins[i].sprite = (int)j;
					break;
				}
			}
		}
	}

	// [RH] Sort the skins, but leave base as skin 0
	//qsort (&skins[PlayerClasses.Size ()], numskins-PlayerClasses.Size (), sizeof(FPlayerSkin), skinsorter);

}